

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O1

void __thiscall lsim::ModelWire::split_at_new_junction(ModelWire *this,Point *p)

{
  Point *pPVar1;
  Point segment;
  bool bVar2;
  ModelWireJunction *pMVar3;
  Point *pPVar4;
  Point *pPVar5;
  long lVar6;
  Point p_end;
  Point local_40;
  Point local_38;
  
  bVar2 = point_is_junction(this,p);
  if (bVar2) {
    return;
  }
  pPVar5 = (Point *)(this->m_segments).
                    super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (Point *)(this->m_segments).
                    super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = *p;
  lVar6 = (long)pPVar1 - (long)pPVar5 >> 5;
  pPVar4 = pPVar5;
  if (0 < lVar6) {
    pPVar4 = (Point *)((long)&(((__uniq_ptr_data<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>,_true,_true>
                                 *)&pPVar5->x)->
                              super___uniq_ptr_impl<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
                              )._M_t.
                              super__Tuple_impl<0UL,_lsim::ModelWireSegment_*,_std::default_delete<lsim::ModelWireSegment>_>
                              .super__Head_base<0UL,_lsim::ModelWireSegment_*,_false>._M_head_impl +
                      ((long)pPVar1 - (long)pPVar5 & 0xffffffffffffffe0U));
    lVar6 = lVar6 + 1;
    pPVar5 = pPVar5 + 2;
    do {
      bVar2 = ModelWireSegment::point_on_segment((ModelWireSegment *)pPVar5[-2],&local_40);
      if (bVar2) {
        pPVar5 = pPVar5 + -2;
        goto LAB_0010ef19;
      }
      bVar2 = ModelWireSegment::point_on_segment((ModelWireSegment *)pPVar5[-1],&local_40);
      if (bVar2) {
        pPVar5 = pPVar5 + -1;
        goto LAB_0010ef19;
      }
      bVar2 = ModelWireSegment::point_on_segment((ModelWireSegment *)*pPVar5,&local_40);
      if (bVar2) goto LAB_0010ef19;
      bVar2 = ModelWireSegment::point_on_segment((ModelWireSegment *)pPVar5[1],&local_40);
      if (bVar2) {
        pPVar5 = pPVar5 + 1;
        goto LAB_0010ef19;
      }
      lVar6 = lVar6 + -1;
      pPVar5 = pPVar5 + 4;
    } while (1 < lVar6);
  }
  lVar6 = (long)pPVar1 - (long)pPVar4 >> 3;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      pPVar5 = pPVar1;
      if ((lVar6 != 3) ||
         (bVar2 = ModelWireSegment::point_on_segment((ModelWireSegment *)*pPVar4,&local_40),
         pPVar5 = pPVar4, bVar2)) goto LAB_0010ef19;
      pPVar4 = pPVar4 + 1;
    }
    bVar2 = ModelWireSegment::point_on_segment((ModelWireSegment *)*pPVar4,&local_40);
    pPVar5 = pPVar4;
    if (bVar2) goto LAB_0010ef19;
    pPVar4 = pPVar4 + 1;
  }
  bVar2 = ModelWireSegment::point_on_segment((ModelWireSegment *)*pPVar4,&local_40);
  pPVar5 = pPVar4;
  if (!bVar2) {
    pPVar5 = pPVar1;
  }
LAB_0010ef19:
  if (pPVar5 != pPVar1) {
    segment = *pPVar5;
    local_38 = (*(ModelWireJunction **)((long)segment + 0x10))->m_position;
    local_40 = segment;
    remove<lsim::ModelWireSegment*>
              (&(*(ModelWireJunction **)((long)segment + 0x10))->m_segments,
               (ModelWireSegment **)&local_40);
    pMVar3 = create_new_junction(this,p,(ModelWireSegment *)segment);
    *(ModelWireJunction **)((long)segment + 0x10) = pMVar3;
    add_segment(this,p,&local_38);
  }
  return;
}

Assistant:

void ModelWire::split_at_new_junction(const Point &p) {
    // nothing to do if there is already a junction at the specified point
    if (point_is_junction(p)) {
        return;
    }

    // find segment containing the point
    auto found = std::find_if(m_segments.begin(), m_segments.end(), 
                                [p](const auto &s) {return s->point_on_segment(p);});
    if (found == m_segments.end()) {
        return;
    }
    auto segment = found->get();
	
	auto p_end = segment->junction(1)->position();
	segment->junction(1)->remove_segment(segment);
	segment->set_junction(1, create_new_junction(p, segment));
	add_segment(p, p_end);
}